

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_read.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  chars local_281;
  string_ref local_280;
  excerpt_tailer tailer;
  vanilla_chronicle_settings settings;
  vanilla_chronicle chronicle;
  
  std::__cxx11::string::string((string *)&chronicle,"/tmp/example",(allocator *)&tailer);
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings(&settings,(string *)&chronicle);
  std::__cxx11::string::~string((string *)&chronicle);
  cornelich::vanilla_chronicle::vanilla_chronicle(&chronicle,&settings);
  cornelich::vanilla_chronicle::create_tailer(&tailer,&chronicle);
  do {
    do {
      bVar1 = cornelich::excerpt_tailer::next_index(&tailer);
    } while (!bVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"int:  ");
    lVar4 = (long)tailer.m_buffer.m_position;
    tailer.m_buffer.m_position = tailer.m_buffer.m_position + 4;
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)poVar2,*(int *)(tailer.m_buffer.m_data + lVar4));
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"text: ");
    local_280 = cornelich::readers::chars::operator()
                          (&local_281,tailer.m_buffer.m_data,&tailer.m_buffer.m_position);
    pbVar3 = boost::operator<<(poVar2,&local_280);
    std::operator<<(pbVar3,'\n');
  } while( true );
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto tailer = chronicle.create_tailer();
    while(true)
    {
        if(!tailer.next_index())
            continue;
        std::cout << "int:  " << tailer.read<int>() << '\n';
        std::cout << "text: " << tailer.read(chr::readers::chars()) << '\n';
    }

}